

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>
          (buffer_appender<char> out,big_decimal_fp *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  int *piVar3;
  int local_1a0;
  int local_19c;
  char local_195;
  int local_194;
  anon_class_48_6_9afe1116 local_190;
  float_specs local_160;
  int local_154;
  undefined1 auStack_150 [4];
  int num_zeros;
  char **local_148;
  int *local_140;
  int *local_138;
  char *local_130;
  int *local_128;
  float_specs local_120;
  int local_114;
  undefined1 auStack_110 [4];
  int num_zeros_3;
  char **local_108;
  int *local_100;
  basic_format_specs<char> *local_f8;
  float_specs *local_f0;
  char *local_e8;
  int *local_e0;
  float_specs local_d8;
  int local_d0;
  int local_cc;
  int num_zeros_2;
  int exp;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_c0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b8;
  float_specs local_b0;
  float_specs local_a8;
  undefined1 local_a0 [8];
  anon_class_40_7_ef14d3db write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int local_64;
  undefined1 auStack_60 [4];
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  char *significand;
  basic_format_specs<char> *pbStack_30;
  char decimal_point_local;
  basic_format_specs<char> *specs_local;
  big_decimal_fp *fp_local;
  float_specs fspecs_local;
  buffer_appender<char> out_local;
  
  _sign = fp->significand;
  significand._7_1_ = decimal_point;
  pbStack_30 = specs;
  specs_local = (basic_format_specs<char> *)fp;
  fp_local = (big_decimal_fp *)fspecs;
  fspecs_local = (float_specs)
                 out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  size._4_4_ = get_significand_size(fp);
  size._0_4_ = fp_local._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(size._4_4_);
  register0x00000000 = (size_t)(tVar2 + ((sign_t)size != none));
  use_exp_format.fspecs.precision = *(int *)((specs_local->fill).data_ + 2) + size._4_4_ + -1;
  _auStack_60 = (float_specs)fp_local;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar1 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)auStack_60);
  if (bVar1) {
    local_64 = 0;
    if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
      if (size._4_4_ == 1) {
        significand._7_1_ = '\0';
      }
    }
    else {
      abs_output_exp = (int)fp_local - size._4_4_;
      exp_digits = 0;
      piVar3 = std::max<int>(&abs_output_exp,&exp_digits);
      local_64 = *piVar3;
      tVar2 = to_unsigned<int>(local_64);
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_194 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_194 = use_exp_format.fspecs._4_4_;
    }
    write._36_4_ = 2;
    if ((99 < local_194) && (write._36_4_ = 3, 999 < local_194)) {
      write._36_4_ = 4;
    }
    tVar2 = to_unsigned<int>((significand._7_1_ != '\0') + 2 + write._36_4_);
    register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    local_195 = 'E';
    if (((ulong)fp_local & 0x1000000000000) == 0) {
      local_195 = 'e';
    }
    write.output_exp._3_1_ = local_195;
    local_a0._0_4_ = (sign_t)size;
    write._0_8_ = _sign;
    write.significand._0_4_ = size._4_4_;
    write.significand._4_1_ = significand._7_1_;
    write.significand_size = local_64;
    write.decimal_point = local_195;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (pbStack_30->width < 1) {
      local_b0 = fspecs_local;
      _num_zeros_2 = fspecs_local;
      local_c0.container =
           (buffer<char> *)reserve<char>((buffer_appender<char>)fspecs_local,register0x00000000);
      local_b8.container =
           (buffer<char> *)
           write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
           ::anon_class_40_7_ef14d3db::operator()
                     ((anon_class_40_7_ef14d3db *)local_a0,(iterator)local_c0.container);
      out_local = base_iterator<fmt::v7::detail::buffer_appender<char>>
                            ((buffer_appender<char>)local_b0,
                             (buffer_appender<char>)local_b8.container);
    }
    else {
      local_a8 = fspecs_local;
      out_local = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                            ((buffer_appender<char>)fspecs_local,pbStack_30,register0x00000000,
                             (anon_class_40_7_ef14d3db *)local_a0);
    }
  }
  else {
    local_cc = *(int *)((specs_local->fill).data_ + 2) + size._4_4_;
    if (*(int *)((specs_local->fill).data_ + 2) < 0) {
      if (local_cc < 1) {
        local_154 = -local_cc;
        if (((size._4_4_ == 0) && (-1 < (int)fp_local)) && ((int)fp_local < local_154)) {
          local_154 = (int)fp_local;
        }
        tVar2 = to_unsigned<int>(local_154);
        register0x00000000 = (tVar2 + 2) + stack0xffffffffffffffb0;
        local_160 = fspecs_local;
        local_190.sign = (sign_t *)&size;
        local_190.num_zeros = &local_154;
        local_190.significand_size = (int *)((long)&size + 4);
        local_190.fspecs = (float_specs *)&fp_local;
        local_190.decimal_point = (char *)((long)&significand + 7);
        local_190.significand = (char **)&sign;
        out_local = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_4_>
                              ((buffer_appender<char>)fspecs_local,pbStack_30,register0x00000000,
                               &local_190);
      }
      else {
        if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
          local_19c = 0;
        }
        else {
          local_19c = (int)fp_local - size._4_4_;
        }
        local_114 = local_19c;
        if (local_19c < 1) {
          local_1a0 = 0;
        }
        else {
          local_1a0 = local_19c;
        }
        tVar2 = to_unsigned<int>(local_1a0);
        register0x00000000 = (tVar2 + 1) + stack0xffffffffffffffb0;
        local_120 = fspecs_local;
        _auStack_150 = (sign_t *)&size;
        local_148 = (char **)&sign;
        local_140 = (int *)((long)&size + 4);
        local_138 = &local_cc;
        local_130 = (char *)((long)&significand + 7);
        local_128 = &local_114;
        out_local = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_>
                              ((buffer_appender<char>)fspecs_local,pbStack_30,register0x00000000,
                               (anon_class_48_6_48d028d1 *)auStack_150);
      }
    }
    else {
      tVar2 = to_unsigned<int>(*(int *)((specs_local->fill).data_ + 2));
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
      local_d0 = (int)fp_local - local_cc;
      if ((fp_local._4_4_ >> 0x14 & 1) != 0) {
        if ((local_d0 < 1) && ((char)((ulong)fp_local >> 0x20) != '\x02')) {
          local_d0 = 1;
        }
        if (0 < local_d0) {
          tVar2 = to_unsigned<int>(local_d0);
          register0x00000000 = tVar2 + stack0xffffffffffffffb0;
        }
      }
      local_d8 = fspecs_local;
      _auStack_110 = (sign_t *)&size;
      local_108 = (char **)&sign;
      local_100 = (int *)((long)&size + 4);
      local_f8 = specs_local;
      local_f0 = (float_specs *)&fp_local;
      local_e8 = (char *)((long)&significand + 7);
      local_e0 = &local_d0;
      out_local = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_2_>
                            ((buffer_appender<char>)fspecs_local,pbStack_30,stack0xffffffffffffffb0,
                             (anon_class_56_7_a2a26a24 *)auStack_110);
    }
  }
  return (buffer_appender<char>)
         out_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}